

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O1

void __thiscall
sc_core::sc_vector_base::context_scope::context_scope(context_scope *this,sc_vector_base *owner)

{
  sc_simcontext *this_00;
  sc_object *psVar1;
  sc_simcontext *this_01;
  sc_object *psVar2;
  
  this->owner_ = (sc_vector_base *)0x0;
  this_00 = (owner->super_sc_object).m_simc;
  if (sc_curr_simcontext == (sc_simcontext *)0x0) {
    this_01 = (sc_simcontext *)operator_new(0x168);
    sc_simcontext::sc_simcontext(this_01);
    sc_curr_simcontext = this_01;
    sc_default_global_context = this_01;
  }
  if (this_00 == sc_curr_simcontext) {
    psVar1 = (owner->super_sc_object).m_parent;
    psVar2 = sc_simcontext::active_object(this_00);
    if (psVar1 != psVar2) {
      this->owner_ = owner;
      sc_object_manager::hierarchy_push
                (((owner->super_sc_object).m_simc)->m_object_manager,
                 (owner->super_sc_object).m_parent);
      return;
    }
    return;
  }
  sc_assertion_failed("simc == sc_get_curr_simcontext()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/utils/sc_vector.cpp"
                      ,0x89);
}

Assistant:

sc_vector_base::context_scope::context_scope( sc_vector_base* owner )
  : owner_(NULL)
{
  sc_simcontext* simc = owner->simcontext();
  sc_assert( simc == sc_get_curr_simcontext() );

  sc_object* parent = owner->get_parent_object();
  sc_object* active = simc->active_object();

  if (parent != active) // override object creation context
  {
    owner_ = owner;
    owner->simcontext()->get_object_manager()
      ->hierarchy_push( owner_->get_parent_object() );
  }
}